

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirSLOT(void)

{
  bool bVar1;
  int iVar2;
  EStatus type;
  char *badValueMessage;
  char *__s;
  aint val;
  char buf [2048];
  
  if (DeviceID == (char *)0x0) {
    Warning("SLOT only allowed in real device emulation mode (See DEVICE)",(char *)0x0,W_PASS3);
    SkipParam(&lp);
    return;
  }
  iVar2 = ParseExpressionNoSyntaxError(&lp,&val);
  if (iVar2 == 0) {
    __s = "[SLOT] Syntax error in <slot_number>";
    type = SUPPRESS;
    badValueMessage = lp;
  }
  else {
    val = CDevice::SlotNumberFromPreciseAddress(Device,val);
    bVar1 = CDevice::SetSlot(Device,val);
    if (bVar1) {
      return;
    }
    __s = buf;
    snprintf(__s,0x800,
             "[SLOT] Slot number must be in range 0..%u, or exact starting address of slot",
             (ulong)(Device->SlotsCount - 1));
    type = IF_FIRST;
    badValueMessage = (char *)0x0;
  }
  Error(__s,badValueMessage,type);
  return;
}

Assistant:

static void dirSLOT() {
	aint val;
	if (!DeviceID) {
		Warning("SLOT only allowed in real device emulation mode (See DEVICE)");
		SkipParam(lp);
		return;
	}
	if (!ParseExpressionNoSyntaxError(lp, val)) {
		Error("[SLOT] Syntax error in <slot_number>", lp, SUPPRESS);
		return;
	}
	val = Device->SlotNumberFromPreciseAddress(val);
	if (!Device->SetSlot(val)) {
		char buf[LINEMAX];
		SPRINTF1(buf, LINEMAX, "[SLOT] Slot number must be in range 0..%u, or exact starting address of slot", Device->SlotsCount - 1);
		Error(buf, NULL, IF_FIRST);
	}
}